

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyDsd.c
# Opt level: O3

Ivy_Obj_t * Ivy_ManDsdConstruct(Ivy_Man_t *p,Vec_Int_t *vFront,Vec_Int_t *vTree)

{
  int *piVar1;
  Ivy_Obj_t *pIVar2;
  long lVar3;
  
  if (0 < vFront->nSize) {
    piVar1 = vFront->pArray;
    lVar3 = 0;
    do {
      piVar1[lVar3] = piVar1[lVar3] >> 8;
      lVar3 = lVar3 + 1;
    } while (lVar3 < vFront->nSize);
  }
  pIVar2 = Ivy_ManDsdConstruct_rec(p,vFront,vTree->nSize + -1,vTree);
  return pIVar2;
}

Assistant:

Ivy_Obj_t * Ivy_ManDsdConstruct( Ivy_Man_t * p, Vec_Int_t * vFront, Vec_Int_t * vTree )
{
    int Entry, i;
    // implement latches on the frontier (TEMPORARY!!!)
    Vec_IntForEachEntry( vFront, Entry, i )
        Vec_IntWriteEntry( vFront, i, Ivy_LeafId(Entry) );
    // recursively construct the tree
    return Ivy_ManDsdConstruct_rec( p, vFront, Vec_IntSize(vTree)-1, vTree );
}